

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O2

Track * __thiscall Track::format(Track *this,CylHead *cylhead,Format *fmt)

{
  int iVar1;
  pointer piVar2;
  Data data;
  Sector sector;
  Header header;
  allocator_type local_c9;
  Track *local_c8;
  uint8_t *local_c0;
  int *local_b8;
  _Vector_base<int,_std::allocator<int>_> local_b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  Sector local_80;
  Header local_40;
  
  if (fmt->sectors != 0) {
    local_c8 = this;
    std::vector<Sector,_std::allocator<Sector>_>::clear(&this->m_sectors);
    std::vector<Sector,_std::allocator<Sector>_>::reserve(&this->m_sectors,(long)fmt->sectors);
    Format::get_ids((vector<int,_std::allocator<int>_> *)&local_b0,fmt,cylhead);
    local_b8 = local_b0._M_impl.super__Vector_impl_data._M_finish;
    local_c0 = &fmt->fill;
    for (piVar2 = local_b0._M_impl.super__Vector_impl_data._M_start; piVar2 != local_b8;
        piVar2 = piVar2 + 1) {
      Header::Header(&local_40,cylhead->cyl,(&fmt->head0)[cylhead->head != 0],*piVar2,fmt->size);
      Sector::Sector(&local_80,fmt->datarate,fmt->encoding,&local_40,fmt->gap3);
      iVar1 = Format::sector_size(fmt);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98,(long)iVar1,
                 local_c0,&local_c9);
      Sector::add(&local_80,(Data *)&local_98,false,0xfb);
      add(local_c8,&local_80);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
      std::vector<Data,_std::allocator<Data>_>::~vector(&local_80.m_data);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b0);
    return local_c8;
  }
  __assert_fail("fmt.sectors != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Track.cpp"
                ,0xf9,"Track &Track::format(const CylHead &, const Format &)");
}

Assistant:

Track& Track::format(const CylHead& cylhead, const Format& fmt)
{
    assert(fmt.sectors != 0);

    m_sectors.clear();
    m_sectors.reserve(fmt.sectors);

    for (auto id : fmt.get_ids(cylhead))
    {
        Header header(cylhead.cyl, cylhead.head ? fmt.head1 : fmt.head0, id, fmt.size);
        Sector sector(fmt.datarate, fmt.encoding, header, fmt.gap3);
        Data data(fmt.sector_size(), fmt.fill);

        sector.add(std::move(data));
        add(std::move(sector));
    }

    return *this;
}